

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O2

mz_bool mz_zip_reader_locate_file_v2
                  (mz_zip_archive *pZip,char *pName,char *pComment,mz_uint flags,mz_uint32 *pIndex)

{
  byte *pbVar1;
  byte bVar2;
  ushort uVar3;
  uint uVar4;
  mz_zip_internal_state *pmVar5;
  void *pvVar6;
  bool bVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  size_t sVar11;
  size_t __n;
  long lVar12;
  ulong uVar13;
  size_t sVar14;
  uint uVar15;
  ulong uVar16;
  byte bVar17;
  ulong uVar18;
  ulong uVar19;
  byte bVar20;
  void *pvVar21;
  long lVar22;
  bool bVar23;
  
  if (pIndex != (mz_uint32 *)0x0) {
    *pIndex = 0;
  }
  if (pZip == (mz_zip_archive *)0x0) {
    return 0;
  }
  pmVar5 = pZip->m_pState;
  if (pName != (char *)0x0 && pmVar5 != (mz_zip_internal_state *)0x0) {
    if (((((pmVar5->m_init_flags & 0x800) == 0) && (pZip->m_zip_mode == MZ_ZIP_MODE_READING)) &&
        (pComment == (char *)0x0 && (flags & 0x300) == 0)) &&
       ((pmVar5->m_sorted_central_dir_offsets).m_size != 0)) {
      pvVar6 = (pmVar5->m_sorted_central_dir_offsets).m_p;
      uVar4 = pZip->m_total_files;
      sVar11 = strlen(pName);
      if (pIndex != (mz_uint32 *)0x0) {
        *pIndex = 0;
      }
      if ((ulong)uVar4 != 0) {
        lVar12 = 0;
        lVar9 = (ulong)uVar4 - 1;
        while (lVar22 = lVar9, lVar12 <= lVar22) {
          uVar16 = (lVar22 - lVar12 >> 1) + lVar12;
          uVar4 = *(uint *)((long)pvVar6 + (uVar16 & 0xffffffff) * 4);
          pvVar21 = (pmVar5->m_central_dir).m_p;
          uVar13 = (ulong)*(uint *)((long)(pmVar5->m_central_dir_offsets).m_p + (ulong)uVar4 * 4);
          uVar3 = *(ushort *)((long)pvVar21 + uVar13 + 0x1c);
          uVar18 = (ulong)uVar3;
          if ((uint)sVar11 <= (uint)uVar3) {
            uVar18 = sVar11 & 0xffffffff;
          }
          bVar17 = 0;
          for (uVar19 = 0; pbVar1 = (byte *)((long)pvVar21 + uVar19 + uVar13 + 0x2e),
              bVar20 = bVar17, pbVar1 < (byte *)((long)pvVar21 + uVar18 + uVar13 + 0x2e);
              uVar19 = uVar19 + 1) {
            bVar20 = *pbVar1;
            bVar17 = bVar20 + 0x20;
            if (0x19 < (byte)(bVar20 + 0xbf)) {
              bVar17 = bVar20;
            }
            bVar2 = pName[uVar19];
            bVar20 = bVar2 + 0x20;
            if (0x19 < (byte)(bVar2 + 0xbf)) {
              bVar20 = bVar2;
            }
            if (bVar17 != bVar20) break;
          }
          iVar10 = (uint)bVar17 - (uint)bVar20;
          if (uVar18 == uVar19) {
            iVar10 = (uint)uVar3 - (uint)sVar11;
          }
          if (iVar10 == 0) {
            if (pIndex != (mz_uint32 *)0x0) {
              *pIndex = uVar4;
              return 1;
            }
            return 1;
          }
          lVar9 = uVar16 - 1;
          if (iVar10 < 0) {
            lVar12 = uVar16 + 1;
            lVar9 = lVar22;
          }
        }
      }
      pZip->m_last_error = MZ_ZIP_FILE_NOT_FOUND;
      return 0;
    }
    sVar11 = strlen(pName);
    if (sVar11 < 0x10000) {
      if (pComment == (char *)0x0) {
        __n = 0;
      }
      else {
        __n = strlen(pComment);
        if (0xffff < __n) {
          pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
          return 0;
        }
      }
      uVar4 = pZip->m_total_files;
      uVar16 = 0;
      do {
        if (uVar16 == uVar4) {
          pZip->m_last_error = MZ_ZIP_FILE_NOT_FOUND;
          return 0;
        }
        pvVar6 = (pmVar5->m_central_dir).m_p;
        uVar13 = (ulong)*(uint *)((long)(pmVar5->m_central_dir_offsets).m_p + uVar16 * 4);
        uVar3 = *(ushort *)((long)pvVar6 + uVar13 + 0x1c);
        uVar18 = (ulong)uVar3;
        if (sVar11 <= uVar18) {
          pvVar21 = (void *)((long)pvVar6 + uVar13 + 0x2e);
          if (__n == 0) {
LAB_001186d1:
            if (((flags >> 9 & 1) != 0) && (uVar3 != 0)) {
              do {
                uVar15 = *(byte *)((long)pvVar21 + (uVar18 - 1 & 0xffffffff)) - 0x2f;
                if ((uVar15 < 0x2e) && ((0x200000000801U >> ((ulong)uVar15 & 0x3f) & 1) != 0))
                goto LAB_00118712;
                bVar7 = 1 < (long)uVar18;
                uVar18 = uVar18 - 1;
              } while (bVar7);
              uVar18 = 0;
LAB_00118712:
              pvVar21 = (void *)((long)pvVar21 + (uVar18 & 0xffffffff));
              uVar18 = (ulong)((uint)uVar3 - (int)uVar18);
            }
            if (sVar11 == uVar18) {
              if ((flags >> 8 & 1) == 0) {
                sVar14 = 0;
                do {
                  if (sVar11 == sVar14) {
                    bVar23 = false;
                    goto LAB_00118789;
                  }
                  bVar17 = pName[sVar14];
                  iVar10 = bVar17 + 0x20;
                  if (0x19 < (byte)(bVar17 + 0xbf)) {
                    iVar10 = (int)(char)bVar17;
                  }
                  bVar17 = *(byte *)((long)pvVar21 + sVar14);
                  iVar8 = bVar17 + 0x20;
                  if (0x19 < (byte)(bVar17 + 0xbf)) {
                    iVar8 = (int)(char)bVar17;
                  }
                  sVar14 = sVar14 + 1;
                } while (iVar10 == iVar8);
              }
              else {
                iVar10 = bcmp(pName,pvVar21,sVar11);
                bVar23 = iVar10 != 0;
LAB_00118789:
                bVar7 = (bool)(bVar23 ^ 1);
                if ((pIndex != (mz_uint32 *)0x0) && (!bVar23)) {
                  *pIndex = (mz_uint32)uVar16;
                  return 1;
                }
LAB_001187b3:
                if (bVar7) {
                  return 1;
                }
              }
            }
          }
          else if (__n == *(ushort *)((long)pvVar6 + uVar13 + 0x20)) {
            uVar19 = (ulong)*(ushort *)((long)pvVar6 + uVar13 + 0x1e);
            if ((flags >> 8 & 1) != 0) {
              iVar10 = bcmp(pComment,(void *)((long)pvVar21 + uVar18 + uVar19),__n);
              bVar7 = false;
              if (iVar10 == 0) goto LAB_001186d1;
              goto LAB_001187b3;
            }
            sVar14 = 0;
            do {
              if (__n == sVar14) goto LAB_001186d1;
              bVar17 = pComment[sVar14];
              iVar10 = bVar17 + 0x20;
              if (0x19 < (byte)(bVar17 + 0xbf)) {
                iVar10 = (int)(char)bVar17;
              }
              bVar17 = *(byte *)((long)pvVar6 + sVar14 + uVar13 + uVar19 + uVar18 + 0x2e);
              iVar8 = bVar17 + 0x20;
              if (0x19 < (byte)(bVar17 + 0xbf)) {
                iVar8 = (int)(char)bVar17;
              }
              sVar14 = sVar14 + 1;
            } while (iVar10 == iVar8);
          }
        }
        uVar16 = uVar16 + 1;
      } while( true );
    }
  }
  pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
  return 0;
}

Assistant:

mz_bool mz_zip_reader_locate_file_v2(mz_zip_archive *pZip, const char *pName, const char *pComment, mz_uint flags, mz_uint32 *pIndex)
{
    mz_uint file_index;
    size_t name_len, comment_len;

    if (pIndex)
        *pIndex = 0;

    if ((!pZip) || (!pZip->m_pState) || (!pName))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    /* See if we can use a binary search */
    if (((pZip->m_pState->m_init_flags & MZ_ZIP_FLAG_DO_NOT_SORT_CENTRAL_DIRECTORY) == 0) &&
        (pZip->m_zip_mode == MZ_ZIP_MODE_READING) &&
        ((flags & (MZ_ZIP_FLAG_IGNORE_PATH | MZ_ZIP_FLAG_CASE_SENSITIVE)) == 0) && (!pComment) && (pZip->m_pState->m_sorted_central_dir_offsets.m_size))
    {
        return mz_zip_locate_file_binary_search(pZip, pName, pIndex);
    }

    /* Locate the entry by scanning the entire central directory */
    name_len = strlen(pName);
    if (name_len > MZ_UINT16_MAX)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    comment_len = pComment ? strlen(pComment) : 0;
    if (comment_len > MZ_UINT16_MAX)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    for (file_index = 0; file_index < pZip->m_total_files; file_index++)
    {
        const mz_uint8 *pHeader = &MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_central_dir, mz_uint8, MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_central_dir_offsets, mz_uint32, file_index));
        mz_uint filename_len = MZ_READ_LE16(pHeader + MZ_ZIP_CDH_FILENAME_LEN_OFS);
        const char *pFilename = (const char *)pHeader + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE;
        if (filename_len < name_len)
            continue;
        if (comment_len)
        {
            mz_uint file_extra_len = MZ_READ_LE16(pHeader + MZ_ZIP_CDH_EXTRA_LEN_OFS), file_comment_len = MZ_READ_LE16(pHeader + MZ_ZIP_CDH_COMMENT_LEN_OFS);
            const char *pFile_comment = pFilename + filename_len + file_extra_len;
            if ((file_comment_len != comment_len) || (!mz_zip_string_equal(pComment, pFile_comment, file_comment_len, flags)))
                continue;
        }
        if ((flags & MZ_ZIP_FLAG_IGNORE_PATH) && (filename_len))
        {
            int ofs = filename_len - 1;
            do
            {
                if ((pFilename[ofs] == '/') || (pFilename[ofs] == '\\') || (pFilename[ofs] == ':'))
                    break;
            } while (--ofs >= 0);
            ofs++;
            pFilename += ofs;
            filename_len -= ofs;
        }
        if ((filename_len == name_len) && (mz_zip_string_equal(pName, pFilename, filename_len, flags)))
        {
            if (pIndex)
                *pIndex = file_index;
            return MZ_TRUE;
        }
    }

    return mz_zip_set_error(pZip, MZ_ZIP_FILE_NOT_FOUND);
}